

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxDecoder.cpp
# Opt level: O0

int __thiscall FluxDecoder::flux_count(FluxDecoder *this)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  bool bVar1;
  reference this_01;
  size_type sVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec;
  const_iterator __end1;
  const_iterator __begin1;
  FluxData *__range1;
  int count;
  FluxDecoder *this_local;
  
  __range1._4_4_ = 0;
  this_00 = this->m_flux_revs;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(this_00);
  vec = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&vec);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
    __range1._4_4_ = (int)sVar2 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int FluxDecoder::flux_count() const
{
    auto count = 0;

    for (const auto& vec : m_flux_revs)
        count += static_cast<int>(vec.size());

    return count;
}